

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::ComputeV1
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *v1)

{
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *plVar1;
  long lVar2;
  long lVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  TPZFMatrix<float> CoarseSolution;
  TPZFMatrix<float> CoarseResidual;
  TPZFMatrix<float> local_270;
  TPZFMatrix<float> local_1e0;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  lVar2 = this->fNumCoarse;
  lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_1e0.fElem = (float *)0x0;
  local_1e0.fGiven = (float *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar2;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_1e0.fWork.fStore = (float *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar7 = lVar3 * lVar2;
  if (uVar7 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar7 < 0x4000000000000000) {
      uVar5 = uVar7 * 4;
    }
    local_1e0.fElem = (float *)operator_new__(uVar5);
  }
  memset(local_1e0.fElem,0,
         local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow *
         local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol * 4);
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix._24_2_ =
       local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix._24_2_ & 0xff00;
  plVar1 = &this->fGlobal;
  p_Var4 = (this->fGlobal).
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    iVar6 = 0;
    do {
      local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018456d0;
      local_270.fElem = (float *)0x0;
      local_270.fGiven = (float *)0x0;
      local_270.fSize = 0;
      TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
      local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
      local_270.fPivot.super_TPZVec<int>.fNElements = 0;
      local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_270.fWork.fNAlloc = 0;
      local_270.fWork.fStore = (float *)0x0;
      local_270.fWork.fNElements = 0;
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018456d0;
      local_150.fSize = 0;
      local_150.fElem = (float *)0x0;
      local_150.fGiven = (float *)0x0;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_150.fWork.fStore = (float *)0x0;
      local_150.fWork.fNElements = 0;
      local_150.fWork.fNAlloc = 0;
      TPZDohrAssembly<float>::Extract(((this->fAssemble).fRef)->fPointer,iVar6,x,&local_270);
      TPZDohrSubstructCondense<float>::Contribute_rc_local
                ((TPZDohrSubstructCondense<float> *)(p_Var4[1]._M_next)->_M_next,&local_270,
                 &local_150);
      TPZDohrAssembly<float>::AssembleCoarse
                (((this->fAssemble).fRef)->fPointer,iVar6,&local_150,&local_1e0);
      TPZFMatrix<float>::~TPZFMatrix(&local_150);
      TPZFMatrix<float>::~TPZFMatrix(&local_270);
      iVar6 = iVar6 + 1;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar1);
  }
  TPZStepSolver<float>::SetDirect(this->fCoarse,ELDLt);
  lVar2 = this->fNumCoarse;
  lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_270.fElem = (float *)0x0;
  local_270.fGiven = (float *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar2;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_270.fWork.fStore = (float *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  uVar7 = lVar3 * lVar2;
  if (uVar7 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar7 < 0x4000000000000000) {
      uVar5 = uVar7 * 4;
    }
    local_270.fElem = (float *)operator_new__(uVar5);
  }
  (*(this->fCoarse->super_TPZMatrixSolver<float>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable
    [0xb])(this->fCoarse,&local_1e0,&local_270);
  p_Var4 = (plVar1->
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    iVar6 = 0;
    do {
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018456d0;
      local_150.fElem = (float *)0x0;
      local_150.fGiven = (float *)0x0;
      local_150.fSize = 0;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_150.fWork.fNAlloc = 0;
      local_150.fWork.fStore = (float *)0x0;
      local_150.fWork.fNElements = 0;
      local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018456d0;
      local_c0.fSize = 0;
      local_c0.fElem = (float *)0x0;
      local_c0.fGiven = (float *)0x0;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_c0.fWork.fStore = (float *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      TPZDohrAssembly<float>::ExtractCoarse
                (((this->fAssemble).fRef)->fPointer,iVar6,&local_270,&local_c0);
      TPZDohrSubstructCondense<float>::Contribute_v1_local
                ((TPZDohrSubstructCondense<float> *)(p_Var4[1]._M_next)->_M_next,&local_150,
                 &local_c0);
      TPZDohrAssembly<float>::Assemble(((this->fAssemble).fRef)->fPointer,iVar6,&local_150,v1);
      TPZFMatrix<float>::~TPZFMatrix(&local_c0);
      TPZFMatrix<float>::~TPZFMatrix(&local_150);
      iVar6 = iVar6 + 1;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar1);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_270);
  TPZFMatrix<float>::~TPZFMatrix(&local_1e0);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}